

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64
drwav_read_pcm_frames_s16le(drwav *pWav,drwav_uint64 framesToRead,drwav_int16 *pBufferOut)

{
  drwav_uint64 dVar1;
  drwav *in_RDX;
  drwav_uint64 framesRead;
  drwav_uint64 iSample;
  drwav_int16 *in_stack_ffffffffffffffb8;
  drwav_uint64 in_stack_ffffffffffffffc0;
  
  dVar1 = drwav_read_pcm_frames_s16(in_RDX,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return dVar1;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_s16le(drwav* pWav, drwav_uint64 framesToRead, drwav_int16* pBufferOut)
{
    drwav_uint64 framesRead = drwav_read_pcm_frames_s16(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && drwav__is_little_endian() == DRWAV_FALSE) {
        drwav__bswap_samples_s16(pBufferOut, framesRead*pWav->channels);
    }

    return framesRead;
}